

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_io_FilePathUtils.cpp
# Opt level: O0

bool axl::io::ensureDirExists(StringRef *fileName0)

{
  char cVar1;
  char *pcVar2;
  bool bVar3;
  int iVar4;
  C *__path;
  StringRefBase<char,_axl::sl::StringDetailsBase<char>_> *in_RDI;
  StringRef *in_stack_00000010;
  int result;
  char c;
  char *p2;
  char *p;
  String fileName;
  StringBase<char,_axl::sl::StringDetailsBase<char>_> *in_stack_ffffffffffffff80;
  undefined6 in_stack_ffffffffffffff88;
  undefined1 in_stack_ffffffffffffff8e;
  undefined1 in_stack_ffffffffffffff8f;
  char *local_50;
  char *local_38;
  StringBase<char,_axl::sl::StringDetailsBase<char>_> local_30;
  bool local_1;
  
  bVar3 = sl::StringRefBase<char,_axl::sl::StringDetailsBase<char>_>::isEmpty(in_RDI);
  if ((bVar3) || (bVar3 = isDir(in_stack_00000010), bVar3)) {
    local_1 = true;
  }
  else {
    sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>::StringBase
              (&local_30,
               (StringRef *)
               CONCAT17(in_stack_ffffffffffffff8f,
                        CONCAT16(in_stack_ffffffffffffff8e,in_stack_ffffffffffffff88)));
    for (local_38 = sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>::getBuffer
                              (in_stack_ffffffffffffff80); *local_38 == '/'; local_38 = local_38 + 1
        ) {
    }
    while (*local_38 != '\0') {
      do {
        pcVar2 = local_38;
        local_50 = pcVar2 + 1;
        bVar3 = false;
        if (*local_50 != '\0') {
          bVar3 = *local_50 != '/';
        }
        local_38 = local_50;
      } while (bVar3);
      cVar1 = *local_50;
      *local_50 = '\0';
      bVar3 = isDir(in_stack_00000010);
      if (!bVar3) {
        __path = sl::StringBase::operator_cast_to_char_
                           ((StringBase<char,_axl::sl::StringDetailsBase<char>_> *)0x16dab1);
        iVar4 = mkdir(__path,0x1c0);
        if (iVar4 != 0) {
          local_1 = err::failWithLastSystemError();
          goto LAB_0016db4a;
        }
      }
      if (cVar1 == '\0') break;
      *local_50 = cVar1;
      for (local_38 = pcVar2 + 2; *local_38 == '/'; local_38 = local_38 + 1) {
      }
    }
    local_1 = true;
LAB_0016db4a:
    sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>::~StringBase
              ((StringBase<char,_axl::sl::StringDetailsBase<char>_> *)0x16db54);
  }
  return (bool)(local_1 & 1);
}

Assistant:

bool
ensureDirExists(const sl::StringRef& fileName0) {
	if (fileName0.isEmpty() || isDir(fileName0))
		return true;

	sl::String fileName = fileName0;

	char* p = fileName.getBuffer(); // ensure exclusive buffer (we're going to modify it)
	while (*p == '/') // skip root
		p++;

	while (*p) {
		char* p2 = p + 1;
		while (*p2 && *p2 != '/')
			p2++;

		char c = *p2; // save
		*p2 = 0;

		if (!isDir(fileName)) {
			int result = ::mkdir(fileName, S_IRWXU);
			if (result != 0)
				return err::failWithLastSystemError();
		}

		if (!c)
			break;

		*p2 = c; // restore

		p = p2 + 1;
		while (*p == '/') // skip separators
			p++;
	}

	return true;
}